

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O3

void __thiscall
Disa::Matrix_Sparse::Matrix_Sparse
          (Matrix_Sparse *this,initializer_list<unsigned_long> non_zero,
          initializer_list<unsigned_long> index,initializer_list<double> value,size_t column)

{
  ulong uVar1;
  double dVar2;
  pointer puVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  __impl **pp_Var6;
  undefined1 auVar7 [16];
  size_type __val;
  undefined8 __first;
  undefined8 __last;
  source_location *psVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  ulong uVar11;
  source_location *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  source_location *psVar14;
  pointer puVar15;
  __impl *p_Var16;
  size_type sVar17;
  unsigned_long uVar18;
  double *pdVar19;
  unsigned_long *puVar20;
  string *this_00;
  pointer pdVar21;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  long lVar22;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  size_type __new_size;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> org_index;
  vector<double,_std::allocator<double>_> new_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  size_type local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  undefined1 local_138 [16];
  pointer local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [16];
  pointer local_e8;
  vector<double,_std::allocator<double>_> *local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d0;
  __impl *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  __impl *local_a0;
  string local_98;
  string local_78;
  string local_58;
  undefined **local_38;
  long lVar26;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->row_non_zero,non_zero,(allocator_type *)&local_1e0);
  local_d0 = &this->column_index;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_d0,index,(allocator_type *)&local_1e0);
  local_d8 = &this->element_value;
  pbVar10 = &local_1e0;
  std::vector<double,_std::allocator<double>_>::vector(local_d8,value,(allocator_type *)pbVar10);
  this->column_size = column;
  psVar8 = (source_location *)
           (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (psVar8->_M_impl == (__impl *)0x0) {
    psVar14 = (source_location *)
              (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar14[-1]._M_impl !=
        (__impl *)
        ((long)(this->column_index).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->column_index).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_1c0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015ec18;
      console_format_abi_cxx11_(&local_1e0,(Disa *)0x0,(Log_Level)&local_1c0,psVar14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_1e0._M_dataplus._M_p,
                          local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"Number of non-zeros does not match number of column non zeros",0x3d);
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_0013cdda;
    }
    psVar12 = psVar8;
    if (psVar8 != psVar14) {
      p_Var16 = (__impl *)0x0;
      do {
        psVar12 = psVar12 + 1;
        if (psVar12 == psVar14) goto LAB_0013c4c1;
        bVar23 = p_Var16 <= psVar12->_M_impl;
        p_Var16 = psVar12->_M_impl;
      } while (bVar23);
    }
    if (psVar12 != psVar14) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_1c0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015ec30;
      console_format_abi_cxx11_(&local_1e0,(Disa *)0x0,(Log_Level)&local_1c0,psVar14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_1e0._M_dataplus._M_p,
                          local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"Inconsistent non-zeros list, but be ascending.",0x2e);
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_0013cdda;
    }
LAB_0013c4c1:
    if (psVar14[-1]._M_impl == (__impl *)value._M_len) {
      local_f8 = (undefined1  [16])0x0;
      local_e8 = (pointer)0x0;
      local_128 = (pointer)0x0;
      local_138 = (undefined1  [16])0x0;
      local_1a0 = 0;
      if ((long)psVar14 - (long)psVar8 != 8) {
        do {
          p_Var16 = psVar8[local_1a0]._M_impl;
          local_a0 = psVar8[local_1a0 + 1]._M_impl;
          __new_size = (long)local_a0 - (long)p_Var16;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_138,__new_size);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)local_f8,__new_size);
          auVar7 = _DAT_00144030;
          __first = local_138._0_8_;
          __last = local_138._8_8_;
          if (local_138._0_8_ != local_138._8_8_) {
            lVar22 = local_138._8_8_ - local_138._0_8_;
            uVar1 = lVar22 - 8;
            auVar27._8_4_ = (int)uVar1;
            auVar27._0_8_ = uVar1;
            auVar27._12_4_ = (int)(uVar1 >> 0x20);
            auVar24._0_8_ = uVar1 >> 3;
            auVar24._8_8_ = auVar27._8_8_ >> 3;
            auVar24 = auVar24 ^ _DAT_00144030;
            uVar11 = 0;
            auVar25 = _DAT_00144020;
            do {
              auVar27 = auVar25 ^ auVar7;
              if ((bool)(~(auVar24._4_4_ < auVar27._4_4_ ||
                          auVar24._0_4_ < auVar27._0_4_ && auVar27._4_4_ == auVar24._4_4_) & 1)) {
                *(ulong *)(local_138._0_8_ + uVar11 * 8) = uVar11;
              }
              if (auVar27._12_4_ <= auVar24._12_4_ &&
                  (auVar27._8_4_ <= auVar24._8_4_ || auVar27._12_4_ != auVar24._12_4_)) {
                *(ulong *)(local_138._0_8_ + (uVar11 + 1) * 8) = uVar11 + 1;
              }
              uVar11 = uVar11 + 2;
              lVar26 = auVar25._8_8_;
              auVar25._0_8_ = auVar25._0_8_ + 2;
              auVar25._8_8_ = lVar26 + 2;
            } while (((uVar1 >> 3) + 2 & 0xfffffffffffffffe) != uVar11);
            lVar26 = 0x3f;
            if (lVar22 >> 3 != 0) {
              for (; (ulong)(lVar22 >> 3) >> lVar26 == 0; lVar26 = lVar26 + -1) {
              }
            }
            __comp._M_comp.row = &local_1a0;
            __comp._M_comp.this = this;
            local_c8 = p_Var16;
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_138._0_8_,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_138._8_8_,(ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e,__comp);
            if (lVar22 < 0x81) {
              __comp_01._M_comp.row = &local_1a0;
              __comp_01._M_comp.this = this;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )__first,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )__last,__comp_01);
              p_Var16 = local_c8;
            }
            else {
              __last_00._M_current = (unsigned_long *)(__first + 0x80);
              __comp_00._M_comp.row = &local_1a0;
              __comp_00._M_comp.this = this;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )__first,__last_00,__comp_00);
              p_Var16 = local_c8;
              if (__last_00._M_current != (unsigned_long *)__last) {
                puVar15 = (this->row_non_zero).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar3 = (this->column_index).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                do {
                  uVar18 = __last_00._M_current[-1];
                  uVar4 = *__last_00._M_current;
                  uVar5 = puVar15[local_1a0];
                  puVar20 = __last_00._M_current;
                  if (puVar3[uVar5 + uVar4] < puVar3[uVar5 + uVar18]) {
                    do {
                      *puVar20 = uVar18;
                      uVar18 = puVar20[-2];
                      uVar5 = puVar15[local_1a0];
                      puVar20 = puVar20 + -1;
                    } while (puVar3[uVar5 + uVar4] < puVar3[uVar5 + uVar18]);
                  }
                  *puVar20 = uVar4;
                  __last_00._M_current = __last_00._M_current + 1;
                } while (__last_00._M_current != (unsigned_long *)__last);
              }
            }
          }
          __val = local_1a0;
          if (local_a0 != p_Var16) {
            puVar15 = (this->row_non_zero).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            psVar8 = (source_location *)
                     (this->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar21 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            sVar17 = 0;
            do {
              lVar22 = (long)&((source_location *)(local_138._0_8_ + sVar17 * 8))->_M_impl->
                              _M_file_name + puVar15[local_1a0];
              *(double *)(local_f8._0_8_ + sVar17 * 8) = pdVar21[lVar22];
              p_Var16 = psVar8[lVar22]._M_impl;
              ((source_location *)(local_138._0_8_ + sVar17 * 8))->_M_impl = p_Var16;
              if ((__impl *)this->column_size <= p_Var16) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
                local_38 = &PTR_s__workspace_llm4binary_github_lic_0015ec60;
                console_format_abi_cxx11_(&local_1e0,(Disa *)0x0,(Log_Level)&local_38,psVar8);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,local_1e0._M_dataplus._M_p,
                                    local_1e0._M_string_length);
                std::__cxx11::to_string(&local_98,*(unsigned_long *)(local_138._0_8_ + sVar17 * 8));
                std::operator+(&local_c0,"Column index, ",&local_98);
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_c0,", in row ");
                local_158._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
                paVar13 = &pbVar10->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p == paVar13) {
                  local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                }
                else {
                  local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_158._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::to_string(&local_58,__val);
                std::operator+(&local_118,&local_158,&local_58);
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_118," not in range");
                local_198._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
                paVar13 = &pbVar10->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p == paVar13) {
                  local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                }
                else {
                  local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_198._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                range_column_abi_cxx11_(&local_78,this);
                std::operator+(&local_178,&local_198,&local_78);
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_178,".");
                local_1c0._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
                paVar13 = &pbVar10->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p == paVar13) {
                  local_1c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                }
                else {
                  local_1c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_1c0._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar9);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::__cxx11::string::~string((string *)&local_178);
                std::__cxx11::string::~string((string *)&local_78);
                std::__cxx11::string::~string((string *)&local_198);
                std::__cxx11::string::~string((string *)&local_118);
                std::__cxx11::string::~string((string *)&local_58);
                std::__cxx11::string::~string((string *)&local_158);
                std::__cxx11::string::~string((string *)&local_c0);
                this_00 = &local_98;
                goto LAB_0013cdd5;
              }
              sVar17 = sVar17 + 1;
            } while (__new_size != sVar17);
          }
          if (local_138._0_8_ != local_138._8_8_) {
            psVar8 = (source_location *)(local_138._0_8_ + 8);
            while (psVar8 != (source_location *)local_138._8_8_) {
              psVar14 = psVar8 + -1;
              psVar12 = psVar8 + 1;
              pp_Var6 = &psVar8->_M_impl;
              psVar8 = psVar12;
              if (psVar14->_M_impl == *pp_Var6) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
                local_98._M_dataplus._M_p =
                     (pointer)&PTR_s__workspace_llm4binary_github_lic_0015ec78;
                console_format_abi_cxx11_(&local_1e0,(Disa *)0x0,(Log_Level)&local_98,psVar12);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,local_1e0._M_dataplus._M_p,
                                    local_1e0._M_string_length);
                std::__cxx11::to_string(&local_158,this->column_size);
                std::operator+(&local_118,"Duplicate column index, ",&local_158);
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_118,"in row ");
                local_198._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
                paVar13 = &pbVar10->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p == paVar13) {
                  local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                }
                else {
                  local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_198._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::to_string(&local_c0,local_1a0);
                std::operator+(&local_178,&local_198,&local_c0);
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_178,".");
                local_1c0._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
                paVar13 = &pbVar10->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p == paVar13) {
                  local_1c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                }
                else {
                  local_1c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_1c0._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar9);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::__cxx11::string::~string((string *)&local_178);
                std::__cxx11::string::~string((string *)&local_c0);
                std::__cxx11::string::~string((string *)&local_198);
                std::__cxx11::string::~string((string *)&local_118);
                this_00 = &local_158;
                goto LAB_0013cdd5;
              }
            }
          }
          uVar4 = (this->row_non_zero).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_1a0];
          if (local_f8._0_8_ != local_f8._8_8_) {
            pdVar21 = (local_d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar4;
            pdVar19 = (double *)local_f8._0_8_;
            do {
              dVar2 = *pdVar19;
              *pdVar19 = *pdVar21;
              *pdVar21 = dVar2;
              pdVar19 = pdVar19 + 1;
              pdVar21 = pdVar21 + 1;
            } while (pdVar19 != (double *)local_f8._8_8_);
          }
          if (local_138._0_8_ != local_138._8_8_) {
            puVar15 = (local_d0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar4;
            psVar8 = (source_location *)local_138._0_8_;
            do {
              p_Var16 = psVar8->_M_impl;
              psVar8->_M_impl = (__impl *)*puVar15;
              *puVar15 = (unsigned_long)p_Var16;
              psVar8 = psVar8 + 1;
              puVar15 = puVar15 + 1;
            } while (psVar8 != (source_location *)local_138._8_8_);
          }
          local_1a0 = local_1a0 + 1;
          psVar8 = (source_location *)
                   (this->row_non_zero).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (local_1a0 <
                 ((long)(this->row_non_zero).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)psVar8 >> 3) - 1U);
        if ((source_location *)local_138._0_8_ != (source_location *)0x0) {
          operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
        }
      }
      if ((pointer)local_f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_c0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015ec48;
    console_format_abi_cxx11_(&local_1e0,(Disa *)0x0,(Log_Level)&local_c0,psVar14);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_1e0._M_dataplus._M_p,local_1e0._M_string_length)
    ;
    std::__cxx11::to_string
              (&local_118,
               (long)(this->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_198,"Mis-match in column and value size, ",&local_118);
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_198," vs. ");
    local_178._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar13 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == paVar13) {
      local_178.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_178._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_158,value._M_len);
    std::operator+(&local_1c0,&local_178,&local_158);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    this_00 = &local_118;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_118._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015ec00;
    console_format_abi_cxx11_
              (&local_1e0,(Disa *)0x0,(Log_Level)&local_118,(source_location *)pbVar10);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_1e0._M_dataplus._M_p,local_1e0._M_string_length)
    ;
    std::__cxx11::to_string
              (&local_198,
               *(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
    std::operator+(&local_178,"First value must be zero, but is ",&local_198);
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_178,".");
    local_1c0._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar13 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == paVar13) {
      local_1c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_1c0._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_178);
    this_00 = &local_198;
  }
LAB_0013cdd5:
  std::__cxx11::string::~string((string *)this_00);
LAB_0013cdda:
  std::__cxx11::string::~string((string *)&local_1e0);
  exit(1);
}

Assistant:

Matrix_Sparse::Matrix_Sparse(std::initializer_list<std::size_t> non_zero, std::initializer_list<std::size_t> index,
                             std::initializer_list<double> value, std::size_t column)
    : row_non_zero(non_zero), column_index(index), element_value(value), column_size(column) {
  ASSERT(row_non_zero.front() == 0, "First value must be zero, but is " + std::to_string(row_non_zero.front()) + ".");
  ASSERT(row_non_zero.back() == column_index.size(), "Number of non-zeros does not match number of column non zeros");
  ASSERT(std::is_sorted(row_non_zero.begin(), row_non_zero.end()), "Inconsistent non-zeros list, but be ascending.");
  ASSERT(column_index.size() == value.size(), "Mis-match in column and value size, " +
                                              std::to_string(column_index.size()) + " vs. " +
                                              std::to_string(value.size()));

  std::vector<double> new_value;
  std::vector<std::size_t> org_index;
  FOR(row, row_non_zero.size() - 1) {
    const std::size_t size_non_zero = row_non_zero[row + 1] - row_non_zero[row];
    org_index.resize(size_non_zero);
    new_value.resize(size_non_zero);
    std::iota(org_index.begin(), org_index.end(), 0);
    std::sort(org_index.begin(), org_index.end(), [&](const std::size_t index_0, const std::size_t index_1) {
      return column_index[row_non_zero[row] + index_0] < column_index[row_non_zero[row] + index_1];
    });

    FOR(i_non_zero, size_non_zero) {
      new_value[i_non_zero] = element_value[row_non_zero[row] + org_index[i_non_zero]];
      org_index[i_non_zero] = column_index[row_non_zero[row] + org_index[i_non_zero]];
      ASSERT(org_index[i_non_zero] < column_size, "Column index, " + std::to_string(org_index[i_non_zero]) +
                                                  ", in row " + std::to_string(row) + " not in range" + range_column() +
                                                  ".");
    }
    ASSERT(std::adjacent_find(org_index.begin(), org_index.end()) == org_index.end(),
           "Duplicate column index, " + std::to_string(column_size) + "in row " + std::to_string(row) + ".");
    std::swap_ranges(new_value.begin(), new_value.end(),
                     std::next(element_value.begin(), static_cast<s_size_t>(row_non_zero[row])));
    std::swap_ranges(org_index.begin(), org_index.end(),
                     std::next(column_index.begin(), static_cast<s_size_t>(row_non_zero[row])));
  }
}